

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::average_cellcenter_to_face
               (Array<MultiFab_*,_3> *fc,MultiFab *cc,Geometry *geom,int ncomp,
               bool use_harmonic_averaging)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Array<MultiFab_*,_3> *pAVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  undefined7 in_register_00000081;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  MFIter mfi;
  int local_280;
  int local_27c;
  Box local_25c;
  Box local_240;
  Box local_224;
  ulong local_208;
  ulong local_200;
  long local_1f8;
  double *local_1f0;
  int local_1e8;
  int local_1e4;
  undefined4 local_1e0;
  int local_1dc;
  ulong local_1d8;
  long local_1d0;
  long local_1c8;
  Array<MultiFab_*,_3> *local_1c0;
  FabArray<amrex::FArrayBox> *local_1b8;
  ulong local_1b0;
  long local_1a8;
  long local_1a0;
  double *local_198;
  Array4<const_double> local_190;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  local_1e0 = (undefined4)CONCAT71(in_register_00000081,use_harmonic_averaging);
  local_1c0 = fc;
  local_1b8 = &cc->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)cc,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_1b0 = (ulong)(uint)ncomp;
    do {
      MFIter::nodaltilebox(&local_224,&local_90,0);
      MFIter::nodaltilebox(&local_240,&local_90,1);
      MFIter::nodaltilebox(&local_25c,&local_90,2);
      pAVar11 = local_1c0;
      iVar10 = local_224.bigend.vect[2];
      iVar9 = local_224.bigend.vect[1];
      iVar8 = local_224.bigend.vect[0];
      iVar7 = local_224.smallend.vect[0];
      iVar12 = local_240.bigend.vect[2];
      iVar13 = local_240.bigend.vect[1];
      iVar18 = local_240.bigend.vect[0];
      iVar14 = local_240.smallend.vect[0];
      iVar6 = local_25c.bigend.vect[2];
      iVar5 = local_25c.bigend.vect[1];
      iVar28 = local_25c.bigend.vect[0];
      iVar21 = local_25c.smallend.vect[0];
      uVar2 = local_240.smallend.vect[1];
      if (local_224.smallend.vect[1] < local_240.smallend.vect[1]) {
        uVar2 = local_224.smallend.vect[1];
      }
      uVar3 = local_240.smallend.vect[2];
      if (local_224.smallend.vect[2] < local_240.smallend.vect[2]) {
        uVar3 = local_224.smallend.vect[2];
      }
      if (local_25c.smallend.vect[1] <= (int)uVar2) {
        uVar2 = local_25c.smallend.vect[1];
      }
      local_208 = (ulong)uVar2;
      if (local_25c.smallend.vect[2] <= (int)uVar3) {
        uVar3 = local_25c.smallend.vect[2];
      }
      local_1d8 = (ulong)uVar3;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&local_1c0->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&pAVar11->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_150,&pAVar11->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_190,local_1b8,&local_90);
      auVar4 = _DAT_00666bc0;
      if (0 < ncomp) {
        if (iVar12 < iVar10) {
          iVar12 = iVar10;
        }
        if (iVar12 <= iVar6) {
          iVar12 = iVar6;
        }
        if (iVar13 < iVar9) {
          iVar13 = iVar9;
        }
        if (iVar13 <= iVar5) {
          iVar13 = iVar5;
        }
        if (iVar18 < iVar8) {
          iVar18 = iVar8;
        }
        if (iVar18 <= iVar28) {
          iVar18 = iVar28;
        }
        if (iVar7 < iVar14) {
          iVar14 = iVar7;
        }
        if (iVar21 <= iVar14) {
          iVar14 = iVar21;
        }
        lVar19 = (long)iVar14;
        local_1a8 = lVar19 * 8;
        local_1e4 = (int)local_208 + -1;
        local_1e8 = (int)local_1d8 + -1;
        local_1dc = iVar14 + -1;
        local_1d0 = 0;
        local_200 = 0;
        do {
          uVar22 = local_1d8 & 0xffffffff;
          local_280 = local_1e8;
          if ((int)local_1d8 <= iVar12) {
            do {
              iVar21 = (int)uVar22;
              if ((int)local_208 <= iVar13) {
                local_1a0 = (long)iVar21;
                uVar22 = local_208;
                local_27c = local_1e4;
                do {
                  iVar28 = (int)uVar22;
                  if (iVar14 <= iVar18) {
                    lVar15 = (long)iVar28;
                    lVar20 = (iVar28 - local_190.begin.y) * local_190.jstride;
                    lVar25 = (iVar21 - local_190.begin.z) * local_190.kstride;
                    local_198 = local_150.p +
                                (lVar15 - local_150.begin.y) * local_150.jstride +
                                (local_1a0 - local_150.begin.z) * local_150.kstride +
                                local_150.nstride * local_200;
                    lVar27 = (lVar15 - local_110.begin.y) * local_110.jstride;
                    lVar24 = (local_1a0 - local_110.begin.z) * local_110.kstride;
                    local_1c8 = (long)local_d0.p +
                                local_d0.nstride * local_1d0 +
                                (lVar15 - local_d0.begin.y) * local_d0.jstride * 8 +
                                (local_1a0 - local_d0.begin.z) * local_d0.kstride * 8 +
                                (long)local_d0.begin.x * -8 + local_1a8;
                    lVar16 = (lVar15 - local_190.begin.y) * local_190.jstride * 8;
                    lVar26 = (local_1a0 - local_190.begin.z) * local_190.kstride * 8;
                    lVar23 = local_190.nstride * local_1d0;
                    lVar17 = (long)local_190.begin.x;
                    lVar15 = lVar26 + lVar16 + lVar23 + lVar17 * -8 + local_1a8;
                    lVar26 = lVar26 + lVar23 +
                             (long)(local_27c - local_190.begin.y) * local_190.jstride * 8 +
                             lVar17 * -8 + local_1a8;
                    lVar16 = lVar23 + lVar16 +
                             (long)(local_280 - local_190.begin.z) * local_190.kstride * 8 +
                             lVar17 * -8 + local_1a8;
                    local_1f8 = (long)local_110.p +
                                local_110.nstride * local_1d0 + lVar24 * 8 + lVar27 * 8 +
                                (long)local_110.begin.x * -8 + local_1a8;
                    local_1f0 = local_110.p +
                                lVar27 + lVar24 + local_110.nstride * local_200 +
                                                  (lVar19 - local_110.begin.x);
                    lVar17 = 0;
                    do {
                      lVar23 = lVar19 + lVar17;
                      if ((char)local_1e0 == '\0') {
                        if (((((local_224.smallend.vect[0] <= lVar23) &&
                              (lVar23 <= local_224.bigend.vect[0])) &&
                             (local_224.smallend.vect[1] <= iVar28)) &&
                            ((iVar28 <= local_224.bigend.vect[1] &&
                             (local_224.smallend.vect[2] <= iVar21)))) &&
                           (iVar21 <= local_224.bigend.vect[2])) {
                          *(double *)(local_1c8 + lVar17 * 8) =
                               (local_190.p
                                [lVar20 + lVar25 + local_190.nstride * local_200 +
                                                   (long)((local_1dc - local_190.begin.x) +
                                                         (int)lVar17)] +
                               *(double *)((long)local_190.p + lVar17 * 8 + lVar15)) * 0.5;
                        }
                        if (((local_240.smallend.vect[0] <= lVar23) &&
                            (lVar23 <= local_240.bigend.vect[0])) &&
                           ((local_240.smallend.vect[1] <= iVar28 &&
                            (((iVar28 <= local_240.bigend.vect[1] &&
                              (local_240.smallend.vect[2] <= iVar21)) &&
                             (iVar21 <= local_240.bigend.vect[2])))))) {
                          *(double *)(local_1f8 + lVar17 * 8) =
                               (*(double *)((long)local_190.p + lVar17 * 8 + lVar26) +
                               *(double *)((long)local_190.p + lVar17 * 8 + lVar15)) * 0.5;
                        }
                        if (((local_25c.smallend.vect[0] <= lVar23) &&
                            (lVar23 <= local_25c.bigend.vect[0])) &&
                           (((local_25c.smallend.vect[1] <= iVar28 &&
                             ((iVar28 <= local_25c.bigend.vect[1] &&
                              (local_25c.smallend.vect[2] <= iVar21)))) &&
                            (iVar21 <= local_25c.bigend.vect[2])))) {
                          dVar29 = (*(double *)((long)local_190.p + lVar17 * 8 + lVar16) +
                                   *(double *)((long)local_190.p + lVar17 * 8 + lVar15)) * 0.5;
                          goto LAB_004822fc;
                        }
                      }
                      else {
                        if ((((local_224.smallend.vect[0] <= lVar23) &&
                             (lVar23 <= local_224.bigend.vect[0])) &&
                            (local_224.smallend.vect[1] <= iVar28)) &&
                           (((iVar28 <= local_224.bigend.vect[1] &&
                             (local_224.smallend.vect[2] <= iVar21)) &&
                            (iVar21 <= local_224.bigend.vect[2])))) {
                          dVar29 = local_190.p
                                   [lVar20 + lVar25 + local_190.nstride * local_200 +
                                                      (long)((local_1dc - local_190.begin.x) +
                                                            (int)lVar17)];
                          dVar31 = 0.0;
                          if ((dVar29 != 0.0) || (NAN(dVar29))) {
                            dVar1 = *(double *)((long)local_190.p + lVar17 * 8 + lVar15);
                            if ((dVar1 != 0.0) || (NAN(dVar1))) {
                              auVar32._8_8_ = dVar1;
                              auVar32._0_8_ = dVar29;
                              auVar32 = divpd(auVar4,auVar32);
                              dVar31 = 2.0 / (auVar32._8_8_ + auVar32._0_8_);
                            }
                          }
                          *(double *)(local_1c8 + lVar17 * 8) = dVar31;
                        }
                        if (((((local_240.smallend.vect[0] <= lVar23) &&
                              (lVar23 <= local_240.bigend.vect[0])) &&
                             (local_240.smallend.vect[1] <= iVar28)) &&
                            ((iVar28 <= local_240.bigend.vect[1] &&
                             (local_240.smallend.vect[2] <= iVar21)))) &&
                           (iVar21 <= local_240.bigend.vect[2])) {
                          dVar29 = *(double *)((long)local_190.p + lVar17 * 8 + lVar26);
                          dVar31 = 0.0;
                          if ((dVar29 != 0.0) || (NAN(dVar29))) {
                            dVar1 = *(double *)((long)local_190.p + lVar17 * 8 + lVar15);
                            if ((dVar1 != 0.0) || (NAN(dVar1))) {
                              auVar30._8_8_ = dVar1;
                              auVar30._0_8_ = dVar29;
                              auVar32 = divpd(auVar4,auVar30);
                              dVar31 = 2.0 / (auVar32._8_8_ + auVar32._0_8_);
                            }
                          }
                          local_1f0[lVar17] = dVar31;
                        }
                        if ((((local_25c.smallend.vect[0] <= lVar23) &&
                             (lVar23 <= local_25c.bigend.vect[0])) &&
                            (local_25c.smallend.vect[1] <= iVar28)) &&
                           (((iVar28 <= local_25c.bigend.vect[1] &&
                             (local_25c.smallend.vect[2] <= iVar21)) &&
                            (iVar21 <= local_25c.bigend.vect[2])))) {
                          dVar31 = *(double *)((long)local_190.p + lVar17 * 8 + lVar16);
                          dVar29 = 0.0;
                          if ((dVar31 != 0.0) || (NAN(dVar31))) {
                            dVar1 = *(double *)((long)local_190.p + lVar17 * 8 + lVar15);
                            if ((dVar1 != 0.0) || (NAN(dVar1))) {
                              auVar33._8_8_ = dVar1;
                              auVar33._0_8_ = dVar31;
                              auVar32 = divpd(auVar4,auVar33);
                              dVar29 = 2.0 / (auVar32._8_8_ + auVar32._0_8_);
                            }
                          }
LAB_004822fc:
                          local_198[(lVar19 + lVar17) - (long)local_150.begin.x] = dVar29;
                        }
                      }
                      lVar17 = lVar17 + 1;
                    } while ((iVar18 - iVar14) + 1 != (int)lVar17);
                  }
                  local_27c = local_27c + 1;
                  uVar22 = (ulong)(iVar28 + 1);
                } while (iVar28 != iVar13);
              }
              local_280 = local_280 + 1;
              uVar22 = (ulong)(iVar21 + 1);
            } while (iVar21 != iVar12);
          }
          local_200 = local_200 + 1;
          local_1d0 = local_1d0 + 8;
        } while (local_200 != local_1b0);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void average_cellcenter_to_face (const Array<MultiFab*,AMREX_SPACEDIM>& fc, const MultiFab& cc,
                                    const Geometry& geom, int ncomp, bool use_harmonic_averaging)
    {
        AMREX_ASSERT(cc.nComp() == ncomp);
        AMREX_ASSERT(cc.nGrow() >= 1);
        AMREX_ASSERT(fc[0]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#if (AMREX_SPACEDIM >= 2)
        AMREX_ASSERT(fc[1]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#endif
#if (AMREX_SPACEDIM == 3)
        AMREX_ASSERT(fc[2]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#endif


#if (AMREX_SPACEDIM == 1)
        const GeometryData& gd = geom.data();
        if (use_harmonic_averaging) {
            AMREX_ASSERT(gd.Coord() == 0);
        }
#else
        amrex::ignore_unused(geom);
#endif

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.const_arrays();
            AMREX_D_TERM(auto const& fxma = fc[0]->arrays();,
                         auto const& fyma = fc[1]->arrays();,
                         auto const& fzma = fc[2]->arrays(););
            MultiFab foo(amrex::convert(cc.boxArray(),IntVect(1)), cc.DistributionMap(), 1, 0,
                         MFInfo().SetAlloc(false));
            IntVect ng = -cc.nGrowVect();
            ParallelFor(foo, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box ccbx(ccma[box_no]);
                ccbx.grow(ng);
                AMREX_D_TERM(Box const& xbx = amrex::surroundingNodes(ccbx,0);,
                             Box const& ybx = amrex::surroundingNodes(ccbx,1);,
                             Box const& zbx = amrex::surroundingNodes(ccbx,2););
#if (AMREX_SPACEDIM == 1)
                amrex_avg_cc_to_fc(i,j,k,n, xbx, fxma[box_no], ccma[box_no], gd, use_harmonic_averaging);
#else
                amrex_avg_cc_to_fc(i,j,k,n, AMREX_D_DECL(xbx,ybx,zbx),
                                   AMREX_D_DECL(fxma[box_no],fyma[box_no],fzma[box_no]),
                                   ccma[box_no], use_harmonic_averaging);
#endif
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                             const Box& ybx = mfi.nodaltilebox(1);,
                             const Box& zbx = mfi.nodaltilebox(2););
                const auto& index_bounds = amrex::getIndexBounds(AMREX_D_DECL(xbx,ybx,zbx));

                AMREX_D_TERM(Array4<Real> const& fxarr = fc[0]->array(mfi);,
                             Array4<Real> const& fyarr = fc[1]->array(mfi);,
                             Array4<Real> const& fzarr = fc[2]->array(mfi););
                Array4<Real const> const& ccarr = cc.const_array(mfi);

#if (AMREX_SPACEDIM == 1)
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(index_bounds, ncomp, i, j, k, n,
                {
                    amrex_avg_cc_to_fc(i,j,k,n, xbx, fxarr, ccarr, gd, use_harmonic_averaging);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(index_bounds, ncomp, i, j, k, n,
                {
                    amrex_avg_cc_to_fc(i,j,k,n, AMREX_D_DECL(xbx,ybx,zbx),
                                       AMREX_D_DECL(fxarr,fyarr,fzarr), ccarr,
                                       use_harmonic_averaging);
                });
#endif
            }
        }
    }